

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall asl::Console::bgcolor(Console *this,Color color)

{
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *attr;
  Color color_local;
  Console *this_local;
  
  if (color == BLACK) {
    local_30 = "40";
  }
  else {
    if (color == RED) {
      local_38 = "41";
    }
    else {
      if (color == GREEN) {
        local_40 = "42";
      }
      else {
        if (color == YELLOW) {
          local_48 = "43";
        }
        else {
          if (color == BLUE) {
            local_50 = "44";
          }
          else {
            if (color == MAGENTA) {
              local_58 = "45";
            }
            else {
              if (color == CYAN) {
                local_60 = "46";
              }
              else {
                if (color == WHITE) {
                  local_68 = "47";
                }
                else {
                  local_68 = "49";
                }
                local_60 = local_68;
              }
              local_58 = local_60;
            }
            local_50 = local_58;
          }
          local_48 = local_50;
        }
        local_40 = local_48;
      }
      local_38 = local_40;
    }
    local_30 = local_38;
  }
  printf("\x1b[%sm",local_30);
  this->_colorChanged = true;
  return;
}

Assistant:

void Console::bgcolor(Color color)
{
	const char* attr =
		color==BLACK? "40":
		color==RED? "41":
		color==GREEN? "42":
		color==YELLOW? "43":
		color==BLUE? "44":
		color==MAGENTA? "45":
		color==CYAN? "46":
		color==WHITE? "47":
		"49";
	printf("\033[%sm", attr);
	_colorChanged = true;
}